

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setInterfaceInfo(CommonCore *this,InterfaceHandle handle,string_view info)

{
  BasicHandleInfo *this_00;
  shared_mutex *__rwlock;
  string_view tag;
  
  __rwlock = &(this->handles).m_mutex;
  std::__shared_mutex_pthread::lock(&__rwlock->_M_impl);
  this_00 = HandleManager::getHandleInfo(&(this->handles).m_obj,handle.hid);
  tag._M_str = "local_info_";
  tag._M_len = 0xb;
  BasicHandleInfo::setTag(this_00,tag,info);
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return;
}

Assistant:

void CommonCore::setInterfaceInfo(helics::InterfaceHandle handle, std::string_view info)
{
    handles.modify(
        [&](auto& hdls) { hdls.getHandleInfo(handle.baseValue())->setTag("local_info_", info); });
}